

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O3

t_int * voutlet_doepilog_resampling(t_int *w)

{
  long lVar1;
  t_int tVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar1 = w[1];
  tVar2 = w[2];
  lVar4 = *(long *)(lVar1 + 0x58);
  if ((int)tVar2 != 0) {
    lVar3 = *(long *)(lVar1 + 0x90);
    lVar5 = 0;
    lVar6 = 0;
    do {
      *(undefined4 *)(lVar3 + lVar6 * 4) = *(undefined4 *)(lVar4 + lVar6 * 4);
      *(undefined4 *)(lVar4 + lVar6 * 4) = 0;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + -4;
    } while ((int)tVar2 != (int)lVar6);
    lVar4 = lVar4 - lVar5;
  }
  if (lVar4 == *(long *)(lVar1 + 0x50)) {
    lVar4 = *(long *)(lVar1 + 0x48);
  }
  *(long *)(lVar1 + 0x58) = lVar4;
  return w + 3;
}

Assistant:

static t_int *voutlet_doepilog_resampling(t_int *w)
{
    t_voutlet *x = (t_voutlet *)(w[1]);
    int n = (int)(w[2]);
    t_sample *in  = x->x_empty;
    t_sample *out = x->x_updown.s_vec;
    for (; n--; in++) *out++ = *in, *in = 0;
    if (in == x->x_endbuf) in = x->x_buf;
    x->x_empty = in;
    return (w+3);
}